

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O0

int sethook(lua_State *L)

{
  int iVar1;
  char *scpt_00;
  char *pcVar2;
  lua_Integer lVar3;
  char *pcVar4;
  uint local_28;
  int mask;
  int count;
  char *smask;
  char *scpt;
  lua_State *L_local;
  
  iVar1 = lua_type(L,1);
  if (iVar1 < 1) {
    lua_sethook(L,(lua_Hook)0x0,0,0);
  }
  else {
    scpt_00 = luaL_checklstring(L,1,(size_t *)0x0);
    pcVar2 = luaL_checklstring(L,2,(size_t *)0x0);
    lVar3 = luaL_optinteger(L,3,0);
    pcVar4 = strchr(pcVar2,99);
    local_28 = (uint)(pcVar4 != (char *)0x0);
    pcVar4 = strchr(pcVar2,0x72);
    if (pcVar4 != (char *)0x0) {
      local_28 = local_28 | 2;
    }
    pcVar2 = strchr(pcVar2,0x6c);
    if (pcVar2 != (char *)0x0) {
      local_28 = local_28 | 4;
    }
    if (0 < (int)lVar3) {
      local_28 = local_28 | 8;
    }
    sethookaux(L,local_28,(int)lVar3,scpt_00);
  }
  return 0;
}

Assistant:

static int sethook (lua_State *L) {
  if (lua_isnoneornil(L, 1))
    lua_sethook(L, NULL, 0, 0);  /* turn off hooks */
  else {
    const char *scpt = luaL_checkstring(L, 1);
    const char *smask = luaL_checkstring(L, 2);
    int count = cast_int(luaL_optinteger(L, 3, 0));
    int mask = 0;
    if (strchr(smask, 'c')) mask |= LUA_MASKCALL;
    if (strchr(smask, 'r')) mask |= LUA_MASKRET;
    if (strchr(smask, 'l')) mask |= LUA_MASKLINE;
    if (count > 0) mask |= LUA_MASKCOUNT;
    sethookaux(L, mask, count, scpt);
  }
  return 0;
}